

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O0

void __thiscall
rsg::ComputeLessOrEqualRange::operator()
          (ComputeLessOrEqualRange *this,Random *rnd,bool dstMin,bool dstMax,float *aMin,float *aMax
          ,float *bMin,float *bMax)

{
  float fVar1;
  float fVar2;
  GetRandom local_51;
  float local_50;
  GetRandom local_49;
  float aLen_1;
  float local_44;
  float aLen;
  float rMax;
  GetRandom local_35;
  float rMin;
  float *pfStack_30;
  float rLen;
  float *aMax_local;
  float *aMin_local;
  bool dstMax_local;
  Random *pRStack_18;
  bool dstMin_local;
  Random *rnd_local;
  ComputeLessOrEqualRange *this_local;
  
  pfStack_30 = aMax;
  aMax_local = aMin;
  aMin_local._6_1_ = dstMax;
  aMin_local._7_1_ = dstMin;
  pRStack_18 = rnd;
  rnd_local = (Random *)this;
  rMin = operator()<float>::GetRandom::operator()(&local_35,rnd,0.0,8.0);
  rMax = operator()<float>::GetRandom::operator()
                   ((GetRandom *)((long)&aLen + 3),pRStack_18,-4.0,4.0);
  local_44 = rMax + rMin;
  if (((aMin_local._7_1_ & 1) == 0) && ((aMin_local._6_1_ & 1) == 1)) {
    *aMax_local = rMax;
    *pfStack_30 = local_44;
    *bMin = rMax;
    *bMax = local_44;
  }
  else if (((aMin_local._7_1_ & 1) == 1) && ((aMin_local._6_1_ & 1) == 1)) {
    fVar1 = operator()<float>::GetRandom::operator()(&local_49,pRStack_18,0.0,8.0 - rMin);
    *pfStack_30 = rMax;
    *aMax_local = *pfStack_30 - fVar1;
    *bMin = rMax;
    *bMax = local_44;
  }
  else {
    local_50 = operator()<float>::GetRandom::operator()(&local_51,pRStack_18,0.0,8.0 - rMin);
    fVar1 = local_44;
    fVar2 = anon_unknown_71::getStep<float>();
    *aMax_local = fVar1 + fVar2;
    *pfStack_30 = *aMax_local + local_50;
    *bMin = rMax;
    *bMax = local_44;
  }
  return;
}

Assistant:

void ComputeLessOrEqualRange::operator () (de::Random& rnd, bool dstMin, bool dstMax, T& aMin, T& aMax, T& bMin, T& bMax) const
{
	struct GetRandom
	{
		int		operator() (de::Random& random, int min, int max) const		{ return random.getInt(min, max); }
		float	operator() (de::Random& random, float min, float max) const	{ return getQuantizedFloat(random, min, max, getStep<float>()); }
	};

	// One random range
	T	rLen	= GetRandom()(rnd, T(0), T(8));
	T	rMin	= GetRandom()(rnd, T(-4), T(4));
	T	rMax	= rMin+rLen;

	if (dstMin == false && dstMax == true)
	{
		// Both values are possible, use same range for both inputs
		aMin	= rMin;
		aMax	= rMax;
		bMin	= rMin;
		bMax	= rMax;
	}
	else if (dstMin == true && dstMax == true)
	{
		// Compute range that is less than or equal to rMin..rMax
		T aLen = GetRandom()(rnd, T(0), T(8)-rLen);

		aMax	= rMin;
		aMin	= aMax - aLen;

		bMin	= rMin;
		bMax	= rMax;
	}
	else
	{
		// Compute range that is greater than rMin..rMax
		T aLen = GetRandom()(rnd, T(0), T(8)-rLen);

		aMin	= rMax + getStep<T>();
		aMax	= aMin + aLen;

		bMin	= rMin;
		bMax	= rMax;
	}
}